

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::selectionChanged
          (QWidgetTextControlPrivate *this,bool forceEmitSelectionChanged)

{
  QWidgetTextControl *this_00;
  long lVar1;
  char cVar2;
  bool _t1;
  int iVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  code *local_60;
  undefined1 *local_58;
  long local_50;
  undefined4 local_48;
  undefined4 local_44;
  int local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControl **)&this->field_0x8;
  if ((int)CONCAT71(in_register_00000031,forceEmitSelectionChanged) != 0) {
    QWidgetTextControl::selectionChanged(this_00);
    lVar1 = *(long *)(*(long *)(this_00 + 8) + 0x10);
    if ((lVar1 != 0) && ((*(byte *)(*(long *)(lVar1 + 8) + 0x30) & 1) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QTextCursor::anchor();
      local_3c = QTextCursor::position();
      local_44 = 0;
      if (iVar3 != -1) {
        local_44 = local_3c;
      }
      local_48 = 0xffffffff;
      local_60 = QPixmap::load;
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0x121);
      local_50 = lVar1;
      local_40 = iVar3;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_60);
    }
  }
  iVar3 = QTextCursor::position();
  if ((iVar3 == this->lastSelectionPosition) &&
     (iVar3 = QTextCursor::anchor(), iVar3 == this->lastSelectionAnchor)) goto LAB_0047a76b;
  cVar2 = QTextCursor::hasSelection();
  if ((bool)cVar2 == (this->lastSelectionPosition == this->lastSelectionAnchor)) {
    _t1 = (bool)QTextCursor::hasSelection();
    QWidgetTextControl::copyAvailable(this_00,_t1);
    if (!forceEmitSelectionChanged) goto LAB_0047a6bf;
  }
  else if (((!forceEmitSelectionChanged) && (cVar2 = QTextCursor::hasSelection(), cVar2 != '\0')) &&
          ((iVar3 = QTextCursor::position(), iVar3 != this->lastSelectionPosition ||
           (iVar3 = QTextCursor::anchor(), iVar3 != this->lastSelectionAnchor)))) {
LAB_0047a6bf:
    QWidgetTextControl::selectionChanged(this_00);
    lVar1 = *(long *)(*(long *)(this_00 + 8) + 0x10);
    if ((lVar1 != 0) && ((*(byte *)(*(long *)(lVar1 + 8) + 0x30) & 1) != 0)) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      iVar3 = QTextCursor::anchor();
      local_3c = QTextCursor::position();
      local_44 = 0;
      if (iVar3 != -1) {
        local_44 = local_3c;
      }
      local_48 = 0xffffffff;
      local_60 = QPixmap::load;
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0x121);
      local_50 = lVar1;
      local_40 = iVar3;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_60);
      QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent
                ((QAccessibleTextSelectionEvent *)&local_60);
    }
  }
  QWidgetTextControl::microFocusChanged(this_00);
  iVar3 = QTextCursor::position();
  this->lastSelectionPosition = iVar3;
  iVar3 = QTextCursor::anchor();
  this->lastSelectionAnchor = iVar3;
LAB_0047a76b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::selectionChanged(bool forceEmitSelectionChanged /*=false*/)
{
    Q_Q(QWidgetTextControl);
    if (forceEmitSelectionChanged) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }

    if (cursor.position() == lastSelectionPosition
        && cursor.anchor() == lastSelectionAnchor)
        return;

    bool selectionStateChange = (cursor.hasSelection()
                                 != (lastSelectionPosition != lastSelectionAnchor));
    if (selectionStateChange)
        emit q->copyAvailable(cursor.hasSelection());

    if (!forceEmitSelectionChanged
        && (selectionStateChange
            || (cursor.hasSelection()
                && (cursor.position() != lastSelectionPosition
                    || cursor.anchor() != lastSelectionAnchor)))) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }
    emit q->microFocusChanged();
    lastSelectionPosition = cursor.position();
    lastSelectionAnchor = cursor.anchor();
}